

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O0

uint ts_subtree_get_changed_ranges
               (Subtree *old_tree,Subtree *new_tree,TreeCursor *cursor1,TreeCursor *cursor2,
               TSLanguage *language,TSRangeArray *included_range_differences,TSRange **ranges)

{
  uint32_t *__return_storage_ptr__;
  bool bVar1;
  Length start;
  Length start_00;
  uint32_t uVar2;
  TSPoint TVar3;
  TSPoint TVar4;
  _Bool _Var5;
  IteratorComparison IVar6;
  Length LVar7;
  Length LVar8;
  byte local_367;
  uint local_2fc;
  Length new_size;
  uint local_2e0;
  Length old_size;
  TSRange *range;
  uint local_294;
  uint local_274;
  TSPoint local_268;
  uint32_t local_260;
  TSPoint local_1f0;
  uint32_t local_1e8;
  TSPoint local_178;
  uint32_t local_170;
  TSPoint local_158;
  uint32_t local_150;
  TSPoint local_138;
  uint32_t local_130;
  bool local_119;
  _Bool is_changed;
  TSPoint local_d8;
  uint32_t local_d0;
  TSPoint local_c4;
  Length next_position;
  uint32_t local_b0;
  TSPoint local_a8;
  Length position;
  uint included_range_difference_index;
  Iterator new_iter;
  Iterator old_iter;
  TSRangeArray results;
  TSRangeArray *included_range_differences_local;
  TSLanguage *language_local;
  TreeCursor *cursor2_local;
  TreeCursor *cursor1_local;
  Subtree *new_tree_local;
  Subtree *old_tree_local;
  
  old_iter.visible_depth = 0;
  old_iter.in_padding = false;
  old_iter._37_3_ = 0;
  iterator_new((Iterator *)&new_iter.visible_depth,cursor1,old_tree,language);
  __return_storage_ptr__ = &position.extent.column;
  iterator_new((Iterator *)__return_storage_ptr__,cursor2,new_tree,language);
  position.extent.row = 0;
  LVar7 = iterator_start_position((Iterator *)&new_iter.visible_depth);
  local_b0 = LVar7.extent.column;
  position.bytes = local_b0;
  next_position.extent = LVar7._0_8_;
  local_a8 = next_position.extent;
  TVar4 = local_a8;
  LVar8 = iterator_start_position((Iterator *)__return_storage_ptr__);
  local_d8 = LVar8._0_8_;
  local_c4 = local_d8;
  TVar3 = local_c4;
  local_d0 = LVar8.extent.column;
  next_position.bytes = local_d0;
  local_a8.row = LVar7.bytes;
  local_c4.row = LVar8.bytes;
  local_c4 = TVar3;
  if (local_a8.row < local_c4.row) {
    start_00.extent.column = position.bytes;
    start_00.bytes = next_position.extent.row;
    start_00.extent.row = next_position.extent.column;
    ts_range_array_add((TSRangeArray *)&old_iter.visible_depth,start_00,LVar8);
    local_a8 = local_d8;
    position.bytes = local_d0;
  }
  else {
    bVar1 = local_c4.row < local_a8.row;
    local_a8 = TVar4;
    if (bVar1) {
      LVar7.extent.column = position.bytes;
      LVar7.bytes = next_position.extent.row;
      LVar7.extent.row = next_position.extent.column;
      ts_range_array_add((TSRangeArray *)&old_iter.visible_depth,LVar8,LVar7);
      local_c4 = next_position.extent;
      next_position.bytes = position.bytes;
    }
  }
  do {
    local_119 = false;
    IVar6 = iterator_compare((Iterator *)&new_iter.visible_depth,(Iterator *)&position.extent.column
                            );
    if (IVar6 == IteratorDiffers) {
      local_119 = true;
      LVar7 = iterator_end_position((Iterator *)&new_iter.visible_depth);
      LVar8 = iterator_end_position((Iterator *)&position.extent.column);
      LVar7 = length_min(LVar7,LVar8);
      local_268 = LVar7._0_8_;
      local_260 = LVar7.extent.column;
      local_c4 = local_268;
      next_position.bytes = local_260;
    }
    else if (IVar6 == IteratorMayDiffer) {
LAB_0012650b:
      _Var5 = iterator_descend((Iterator *)&new_iter.visible_depth,local_a8.row);
      if (_Var5) {
        _Var5 = iterator_descend((Iterator *)&position.extent.column,local_a8.row);
        local_119 = !_Var5;
        if (local_119) {
          LVar7 = iterator_end_position((Iterator *)&new_iter.visible_depth);
          local_158 = LVar7._0_8_;
          local_150 = LVar7.extent.column;
          local_c4 = local_158;
          next_position.bytes = local_150;
        }
      }
      else {
        local_119 = iterator_descend((Iterator *)&position.extent.column,local_a8.row);
        if (local_119) {
          LVar7 = iterator_end_position((Iterator *)&position.extent.column);
          local_178 = LVar7._0_8_;
          local_170 = LVar7.extent.column;
          local_c4 = local_178;
          next_position.bytes = local_170;
        }
        else {
          LVar7 = iterator_end_position((Iterator *)&new_iter.visible_depth);
          LVar8 = iterator_end_position((Iterator *)&position.extent.column);
          LVar7 = length_min(LVar7,LVar8);
          local_1f0 = LVar7._0_8_;
          local_1e8 = LVar7.extent.column;
          local_c4 = local_1f0;
          next_position.bytes = local_1e8;
        }
      }
    }
    else if (IVar6 == IteratorMatches) {
      LVar7 = iterator_end_position((Iterator *)&new_iter.visible_depth);
      local_138 = LVar7._0_8_;
      local_130 = LVar7.extent.column;
      local_c4 = local_138;
      TVar3 = local_c4;
      next_position.bytes = local_130;
      local_c4.row = LVar7.bytes;
      _Var5 = ts_range_array_intersects
                        (included_range_differences,position.extent.row,local_a8.row,local_c4.row);
      local_c4 = TVar3;
      if (_Var5) {
        local_c4 = local_a8;
        next_position.bytes = position.bytes;
        goto LAB_0012650b;
      }
    }
    while( true ) {
      _Var5 = iterator_done((Iterator *)&new_iter.visible_depth);
      bVar1 = false;
      uVar2 = local_c4.row;
      if (!_Var5) {
        LVar7 = iterator_end_position((Iterator *)&new_iter.visible_depth);
        local_274 = LVar7.bytes;
        bVar1 = local_274 <= local_c4.row;
      }
      if (!bVar1) break;
      iterator_advance((Iterator *)&new_iter.visible_depth);
    }
    while( true ) {
      _Var5 = iterator_done((Iterator *)&position.extent.column);
      bVar1 = false;
      if (!_Var5) {
        LVar7 = iterator_end_position((Iterator *)&position.extent.column);
        local_294 = LVar7.bytes;
        bVar1 = local_294 <= local_c4.row;
      }
      if (!bVar1) break;
      iterator_advance((Iterator *)&position.extent.column);
    }
    while ((uint)new_iter.language < (uint)old_iter.language) {
      iterator_ascend((Iterator *)&new_iter.visible_depth);
    }
    while ((uint)old_iter.language < (uint)new_iter.language) {
      iterator_ascend((Iterator *)&position.extent.column);
    }
    if (local_119 != false) {
      start.extent.column = position.bytes;
      start.bytes = local_a8.row;
      start.extent.row = local_a8.column;
      LVar8.extent.column = next_position.bytes;
      LVar8.bytes = local_c4.row;
      LVar8.extent.row = local_c4.column;
      ts_range_array_add((TSRangeArray *)&old_iter.visible_depth,start,LVar8);
    }
    local_a8 = local_c4;
    position.bytes = next_position.bytes;
    while ((position.extent.row < included_range_differences->size &&
           (included_range_differences->contents[position.extent.row].end_byte <= uVar2))) {
      position.extent.row = position.extent.row + 1;
    }
    _Var5 = iterator_done((Iterator *)&new_iter.visible_depth);
    local_367 = 0;
    if (!_Var5) {
      _Var5 = iterator_done((Iterator *)&position.extent.column);
      local_367 = _Var5 ^ 0xff;
    }
    if ((local_367 & 1) == 0) {
      LVar7 = ts_subtree_total_size(*old_tree);
      LVar8 = ts_subtree_total_size(*new_tree);
      local_2e0 = LVar7.bytes;
      local_2fc = LVar8.bytes;
      if (local_2e0 < local_2fc) {
        ts_range_array_add((TSRangeArray *)&old_iter.visible_depth,LVar7,LVar8);
      }
      else if (local_2fc < local_2e0) {
        ts_range_array_add((TSRangeArray *)&old_iter.visible_depth,LVar8,LVar7);
      }
      cursor1->tree = (TSTree *)new_iter._32_8_;
      (cursor1->stack).contents = (TreeCursorEntry *)old_iter.cursor.tree;
      *(TreeCursorEntry **)&(cursor1->stack).size = old_iter.cursor.stack.contents;
      cursor2->tree = stack0xffffffffffffff68;
      (cursor2->stack).contents = (TreeCursorEntry *)new_iter.cursor.tree;
      *(TreeCursorEntry **)&(cursor2->stack).size = new_iter.cursor.stack.contents;
      *ranges = (TSRange *)old_iter._32_8_;
      return 0;
    }
  } while( true );
}

Assistant:

unsigned ts_subtree_get_changed_ranges(const Subtree *old_tree, const Subtree *new_tree,
                                       TreeCursor *cursor1, TreeCursor *cursor2,
                                       const TSLanguage *language,
                                       const TSRangeArray *included_range_differences,
                                       TSRange **ranges) {
  TSRangeArray results = array_new();

  Iterator old_iter = iterator_new(cursor1, old_tree, language);
  Iterator new_iter = iterator_new(cursor2, new_tree, language);

  unsigned included_range_difference_index = 0;

  Length position = iterator_start_position(&old_iter);
  Length next_position = iterator_start_position(&new_iter);
  if (position.bytes < next_position.bytes) {
    ts_range_array_add(&results, position, next_position);
    position = next_position;
  } else if (position.bytes > next_position.bytes) {
    ts_range_array_add(&results, next_position, position);
    next_position = position;
  }

  do {
    #ifdef DEBUG_GET_CHANGED_RANGES
    printf("At [%-2u, %-2u] Compare ", position.extent.row, position.extent.column);
    iterator_print_state(&old_iter);
    printf("\tvs\t");
    iterator_print_state(&new_iter);
    puts("");
    #endif

    bool is_changed = false;
    switch (iterator_compare(&old_iter, &new_iter)) {
      case IteratorMatches:
        next_position = iterator_end_position(&old_iter);
        if (ts_range_array_intersects(
          included_range_differences,
          included_range_difference_index,
          position.bytes, next_position.bytes
        )) {
          next_position = position;
          // fall through
        } else {
          break;
        }

      case IteratorMayDiffer:
        if (iterator_descend(&old_iter, position.bytes)) {
          if (!iterator_descend(&new_iter, position.bytes)) {
            is_changed = true;
            next_position = iterator_end_position(&old_iter);
          }
        } else if (iterator_descend(&new_iter, position.bytes)) {
          is_changed = true;
          next_position = iterator_end_position(&new_iter);
        } else {
          next_position = length_min(
            iterator_end_position(&old_iter),
            iterator_end_position(&new_iter)
          );
        }
        break;

      case IteratorDiffers:
        is_changed = true;
        next_position = length_min(
          iterator_end_position(&old_iter),
          iterator_end_position(&new_iter)
        );
        break;
    }

    while (
      !iterator_done(&old_iter) &&
      iterator_end_position(&old_iter).bytes <= next_position.bytes
    ) iterator_advance(&old_iter);

    while (
      !iterator_done(&new_iter) &&
      iterator_end_position(&new_iter).bytes <= next_position.bytes
    ) iterator_advance(&new_iter);

    while (old_iter.visible_depth > new_iter.visible_depth) iterator_ascend(&old_iter);

    while (new_iter.visible_depth > old_iter.visible_depth) iterator_ascend(&new_iter);

    if (is_changed) {
      #ifdef DEBUG_GET_CHANGED_RANGES
      printf(
        "  change: [[%u, %u] - [%u, %u]]\n",
        position.extent.row, position.extent.column,
        next_position.extent.row, next_position.extent.column
      );
      #endif

      ts_range_array_add(&results, position, next_position);
    }

    position = next_position;

    while (included_range_difference_index < included_range_differences->size) {
      const TSRange *range = &included_range_differences->contents[included_range_difference_index];
      if (range->end_byte <= position.bytes) {
        included_range_difference_index++;
      } else {
        break;
      }
    }
  } while (!iterator_done(&old_iter) && !iterator_done(&new_iter));

  Length old_size = ts_subtree_total_size(*old_tree);
  Length new_size = ts_subtree_total_size(*new_tree);
  if (old_size.bytes < new_size.bytes) {
    ts_range_array_add(&results, old_size, new_size);
  } else if (new_size.bytes < old_size.bytes) {
    ts_range_array_add(&results, new_size, old_size);
  }

  *cursor1 = old_iter.cursor;
  *cursor2 = new_iter.cursor;
  *ranges = results.contents;
  return results.size;
}